

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

DatabaseInterface * __thiscall
Fossilize::ConcurrentDatabase::get_sub_database(ConcurrentDatabase *this,uint index)

{
  size_type sVar1;
  reference this_00;
  uint index_local;
  ConcurrentDatabase *this_local;
  
  if (this->mode == ReadOnly) {
    if (index == 0) {
      this_local = (ConcurrentDatabase *)
                   std::
                   unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ::get(&this->readonly_interface);
    }
    else {
      sVar1 = std::
              vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
              ::size(&this->extra_readonly);
      if (sVar1 < index) {
        this_local = (ConcurrentDatabase *)0x0;
      }
      else {
        this_00 = std::
                  vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                  ::operator[](&this->extra_readonly,(ulong)(index - 1));
        this_local = (ConcurrentDatabase *)
                     std::
                     unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     ::get(this_00);
      }
    }
  }
  else {
    this_local = (ConcurrentDatabase *)0x0;
  }
  return &this_local->super_DatabaseInterface;
}

Assistant:

DatabaseInterface *get_sub_database(unsigned index) override
	{
		if (mode != DatabaseMode::ReadOnly)
			return nullptr;

		if (index == 0)
			return readonly_interface.get();
		else if (index <= extra_readonly.size())
			return extra_readonly[index - 1].get();
		else
			return nullptr;
	}